

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::Upgrade
          (LegacyScriptPubKeyMan *this,int prev_version,int new_version,bilingual_str *error)

{
  WalletStorage *pWVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  WalletDatabase *pWVar5;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  CPubKey masterPubKey;
  unique_lock<std::recursive_mutex> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_b0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b0);
  pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar4 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
  bVar8 = true;
  if ((char)iVar4 == '\0') {
    bVar2 = IsFeatureSupported(new_version,130000);
    if (bVar2) {
      iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])(this)
      ;
      if ((char)iVar4 != '\0') goto LAB_004ee7bd;
      ScriptPubKeyMan::WalletLogPrintf<>((ScriptPubKeyMan *)this,"Upgrading wallet to HD\n");
      pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      (*pWVar1->_vptr_WalletStorage[7])(pWVar1,130000,0);
      GenerateNewSeed((CPubKey *)local_80,this);
      SetHDSeed(this,(CPubKey *)local_80);
      bVar2 = true;
    }
    else {
LAB_004ee7bd:
      bVar2 = false;
    }
    bVar3 = IsFeatureSupported(prev_version,0x2227c);
    if (!bVar3) {
      bVar3 = IsFeatureSupported(new_version,0x2227c);
      if (bVar3) {
        ScriptPubKeyMan::WalletLogPrintf<>
                  ((ScriptPubKeyMan *)this,"Upgrading wallet to use HD chain split\n");
        pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
        (*pWVar1->_vptr_WalletStorage[7])(pWVar1,0x297ac,0);
        if ((this->super_LegacyDataSPKM).m_hd_chain.nVersion < 2) {
          (this->super_LegacyDataSPKM).m_hd_chain.nVersion = 2;
          iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->
                    _vptr_WalletStorage[3])();
          pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar4);
          (*pWVar5->_vptr_WalletDatabase[0xe])(local_80,pWVar5,1);
          local_80._8_8_ = pWVar5;
          bVar3 = WalletBatch::WriteHDChain
                            ((WalletBatch *)local_80,&(this->super_LegacyDataSPKM).m_hd_chain);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_80._0_8_)->_M_allocated_capacity + 0x28))();
          }
          if (!bVar3) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Upgrade","");
            pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_a0,": writing chain failed");
            local_80._0_8_ = (pbVar6->_M_dataplus)._M_p;
            paVar7 = &pbVar6->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._0_8_ == paVar7) {
              local_70._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_70._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              local_80._0_8_ = &local_70;
            }
            else {
              local_70._M_allocated_capacity = paVar7->_M_allocated_capacity;
            }
            local_80._8_8_ = pbVar6->_M_string_length;
            (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
            pbVar6->_M_string_length = 0;
            (pbVar6->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(this_00,(string *)local_80);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_004eeb74;
          }
        }
        if (prev_version < 0x2227c) {
          MarkPreSplitKeys(this);
        }
      }
    }
    if (bVar2) {
      bVar2 = NewKeyPool(this);
      if (!bVar2) {
        local_80._0_8_ = &local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_80,"Unable to generate keys","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"Unable to generate keys","");
        }
        else {
          local_a0._M_dataplus._M_p = "Unable to generate keys";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_60,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_a0);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._0_8_ != &local_70) {
          operator_delete((void *)local_80._0_8_,local_70._M_allocated_capacity + 1);
        }
        bVar8 = false;
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
LAB_004eeb74:
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::Upgrade(int prev_version, int new_version, bilingual_str& error)
{
    LOCK(cs_KeyStore);

    if (m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        // Nothing to do here if private keys are not enabled
        return true;
    }

    bool hd_upgrade = false;
    bool split_upgrade = false;
    if (IsFeatureSupported(new_version, FEATURE_HD) && !IsHDEnabled()) {
        WalletLogPrintf("Upgrading wallet to HD\n");
        m_storage.SetMinVersion(FEATURE_HD);

        // generate a new master key
        CPubKey masterPubKey = GenerateNewSeed();
        SetHDSeed(masterPubKey);
        hd_upgrade = true;
    }
    // Upgrade to HD chain split if necessary
    if (!IsFeatureSupported(prev_version, FEATURE_HD_SPLIT) && IsFeatureSupported(new_version, FEATURE_HD_SPLIT)) {
        WalletLogPrintf("Upgrading wallet to use HD chain split\n");
        m_storage.SetMinVersion(FEATURE_PRE_SPLIT_KEYPOOL);
        split_upgrade = FEATURE_HD_SPLIT > prev_version;
        // Upgrade the HDChain
        if (m_hd_chain.nVersion < CHDChain::VERSION_HD_CHAIN_SPLIT) {
            m_hd_chain.nVersion = CHDChain::VERSION_HD_CHAIN_SPLIT;
            if (!WalletBatch(m_storage.GetDatabase()).WriteHDChain(m_hd_chain)) {
                throw std::runtime_error(std::string(__func__) + ": writing chain failed");
            }
        }
    }
    // Mark all keys currently in the keypool as pre-split
    if (split_upgrade) {
        MarkPreSplitKeys();
    }
    // Regenerate the keypool if upgraded to HD
    if (hd_upgrade) {
        if (!NewKeyPool()) {
            error = _("Unable to generate keys");
            return false;
        }
    }
    return true;
}